

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O2

Vertex * Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                   (Vertex *__return_storage_ptr__,Vertex *v0,ai_real f)

{
  long lVar1;
  aiVector3t<float> aVar2;
  aiColor4t<float> aVar3;
  
  memset(__return_storage_ptr__->texcoords,0,0xe0);
  aVar2 = ::operator*(&v0->position,f);
  (__return_storage_ptr__->position).x = (float)(int)aVar2._0_8_;
  (__return_storage_ptr__->position).y = (float)(int)((ulong)aVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->position).z = aVar2.z;
  aVar2 = ::operator*(&v0->normal,f);
  (__return_storage_ptr__->normal).x = (float)(int)aVar2._0_8_;
  (__return_storage_ptr__->normal).y = (float)(int)((ulong)aVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->normal).z = aVar2.z;
  aVar2 = ::operator*(&v0->tangent,f);
  (__return_storage_ptr__->tangent).x = (float)(int)aVar2._0_8_;
  (__return_storage_ptr__->tangent).y = (float)(int)((ulong)aVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->tangent).z = aVar2.z;
  aVar2 = ::operator*(&v0->bitangent,f);
  (__return_storage_ptr__->bitangent).x = (float)(int)aVar2._0_8_;
  (__return_storage_ptr__->bitangent).y = (float)(int)((ulong)aVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->bitangent).z = aVar2.z;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0xc) {
    aVar2 = ::operator*((aiVector3t<float> *)((long)&v0->texcoords[0].x + lVar1),f);
    *(long *)((long)&__return_storage_ptr__->texcoords[0].x + lVar1) = aVar2._0_8_;
    *(float *)((long)&__return_storage_ptr__->texcoords[0].z + lVar1) = aVar2.z;
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    aVar3 = ::operator*((aiColor4t<float> *)((long)&v0->colors[0].r + lVar1),f);
    *(aiColor4t<float> *)((long)&__return_storage_ptr__->colors[0].r + lVar1) = aVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, ai_real f) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D,ai_real,aiVector3D>()(v0.position,f);
        res.normal    = op<aiVector3D,ai_real,aiVector3D>()(v0.normal,f);
        res.tangent   = op<aiVector3D,ai_real,aiVector3D>()(v0.tangent,f);
        res.bitangent = op<aiVector3D,ai_real,aiVector3D>()(v0.bitangent,f);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D,ai_real,aiVector3D>()(v0.texcoords[i],f);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D,ai_real,aiColor4D>()(v0.colors[i],f);
        }
        return res;
    }